

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_event_init(ma_context *pContext,ma_event *pEvent)

{
  ma_event *pEvent_local;
  ma_context *pContext_local;
  
  if ((pContext == (ma_context *)0x0) || (pEvent == (ma_event *)0x0)) {
    pContext_local._4_4_ = 0;
  }
  else {
    pEvent->pContext = pContext;
    pContext_local._4_4_ = ma_event_init__posix(pContext,pEvent);
  }
  return pContext_local._4_4_;
}

Assistant:

MA_API ma_result ma_event_init(ma_context* pContext, ma_event* pEvent)
{
    if (pContext == NULL || pEvent == NULL) {
        return MA_FALSE;
    }

    pEvent->pContext = pContext;

#ifdef MA_WIN32
    return ma_event_init__win32(pContext, pEvent);
#endif
#ifdef MA_POSIX
    return ma_event_init__posix(pContext, pEvent);
#endif
}